

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O0

Range __thiscall cppjieba::PreFilter::Next(PreFilter *this)

{
  const_iterator pRVar1;
  const_iterator pRVar2;
  Range RVar3;
  bool bVar4;
  const_iterator pRVar5;
  PreFilter *this_local;
  Range range;
  
  pRVar1 = this->cursor_;
  do {
    pRVar2 = this->cursor_;
    pRVar5 = limonp::LocalVector<cppjieba::RuneStr>::end(&this->sentence_);
    if (pRVar2 == pRVar5) {
      range.begin = limonp::LocalVector<cppjieba::RuneStr>::end(&this->sentence_);
LAB_001164cd:
      RVar3.end = range.begin;
      RVar3.begin = pRVar1;
      return RVar3;
    }
    bVar4 = std::
            IsIn<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                      (this->symbols_,&this->cursor_->rune);
    if (bVar4) {
      if (pRVar1 == this->cursor_) {
        this->cursor_ = this->cursor_ + 1;
      }
      range.begin = this->cursor_;
      goto LAB_001164cd;
    }
    this->cursor_ = this->cursor_ + 1;
  } while( true );
}

Assistant:

Range Next() {
    Range range;
    range.begin = cursor_;
    while (cursor_ != sentence_.end()) {
      if (IsIn(symbols_, cursor_->rune)) {
        if (range.begin == cursor_) {
          cursor_ ++;
        }
        range.end = cursor_;
        return range;
      }
      cursor_ ++;
    }
    range.end = sentence_.end();
    return range;
  }